

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

_Bool sx_coro_replace_callback(sx_coro_context *ctx,sx_fiber_cb *callback,sx_fiber_cb *new_callback)

{
  sx__coro_state *psVar1;
  code *pcVar2;
  undefined1 uVar3;
  _Bool _Var4;
  sx_fiber_t pvVar5;
  sx__coro_state *node;
  
  if (callback == (sx_fiber_cb *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0x119,"callback");
    pcVar2 = (code *)swi(3);
    uVar3 = (*pcVar2)();
    return (_Bool)uVar3;
  }
  _Var4 = false;
  psVar1 = ctx->run_list;
  while (node = psVar1, node != (sx__coro_state *)0x0) {
    psVar1 = node->next;
    if (node->callback == callback) {
      if (new_callback == (sx_fiber_cb *)0x0) {
        sx__coro_remove_list(&ctx->run_list,&ctx->run_list_last,node);
        sx_pool_del(ctx->coro_pool,node);
      }
      else {
        node->callback = new_callback;
        pvVar5 = (sx_fiber_t)make_fcontext((node->stack_mem).sptr,(node->stack_mem).ssize);
        node->fiber = pvVar5;
        _Var4 = true;
      }
    }
  }
  return _Var4;
}

Assistant:

bool sx_coro_replace_callback(sx_coro_context* ctx, sx_fiber_cb* callback,
                              sx_fiber_cb* new_callback)
{
    sx_assert(callback);
    bool r = false;

    sx__coro_state* fs = ctx->run_list;
    while (fs) {
        sx__coro_state* next = fs->next;

        // just remove the fiber if the new callback is NULL
        if (fs->callback == callback) {
            if (new_callback) {
                fs->callback = new_callback;
                fs->fiber = sx_fiber_create(fs->stack_mem, new_callback);
                r = true;
            } else {
                sx__coro_remove_list(&ctx->run_list, &ctx->run_list_last, fs);
                sx_pool_del(ctx->coro_pool, fs);
            }
        }
        fs = next;
    }

    return r;
}